

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZTensor.h
# Opt level: O2

void __thiscall
TPZTensor<double>::EigenProjection
          (TPZTensor<double> *this,TPZVec<double> *EigenVals,int index,
          TPZVec<int> *DistinctEigenvalues,TPZTensor<double> *Ei)

{
  uint uVar1;
  int iVar2;
  double *pdVar3;
  ulong uVar4;
  int count;
  ulong uVar5;
  TPZFNMatrix<9,_double> aux;
  TPZFNMatrix<9,_double> resultingTensor;
  TPZFNMatrix<9,_double> local;
  
  uVar1 = (uint)DistinctEigenvalues->fNElements;
  TPZFNMatrix<9,_double>::TPZFNMatrix(&local,3,3);
  TPZFNMatrix<9,_double>::TPZFNMatrix(&aux,3,3);
  TPZFNMatrix<9,_double>::TPZFNMatrix(&resultingTensor,3,3);
  pdVar3 = (Ei->fData).super_TPZVec<double>.fStore;
  *pdVar3 = 1.0;
  pdVar3[5] = 1.0;
  pdVar3[3] = 1.0;
  pdVar3[4] = 0.0;
  pdVar3[1] = 0.0;
  pdVar3[2] = 0.0;
  uVar5 = 0;
  uVar4 = (ulong)uVar1;
  if ((int)uVar1 < 1) {
    uVar4 = uVar5;
  }
  for (; uVar4 != uVar5; uVar5 = uVar5 + 1) {
    iVar2 = DistinctEigenvalues->fStore[uVar5];
    if (iVar2 != index) {
      TPZMatrix<double>::Identity((TPZMatrix<double> *)&local);
      TPZFMatrix<double>::operator*=(&local.super_TPZFMatrix<double>,-EigenVals->fStore[iVar2]);
      CopyToTensor(this,&aux.super_TPZFMatrix<double>);
      TPZFMatrix<double>::operator+=(&local.super_TPZFMatrix<double>,(TPZMatrix<double> *)&aux);
      TPZFMatrix<double>::operator*=
                (&local.super_TPZFMatrix<double>,
                 1.0 / (EigenVals->fStore[index] - EigenVals->fStore[iVar2]));
      CopyToTensor(Ei,&aux.super_TPZFMatrix<double>);
      TPZMatrix<double>::Multiply
                ((TPZMatrix<double> *)&aux,&local.super_TPZFMatrix<double>,
                 &resultingTensor.super_TPZFMatrix<double>,0);
      pdVar3 = TPZFMatrix<double>::operator()(&resultingTensor.super_TPZFMatrix<double>,0,0);
      *(Ei->fData).super_TPZVec<double>.fStore = *pdVar3;
      pdVar3 = TPZFMatrix<double>::operator()(&resultingTensor.super_TPZFMatrix<double>,0,1);
      (Ei->fData).super_TPZVec<double>.fStore[1] = *pdVar3;
      pdVar3 = TPZFMatrix<double>::operator()(&resultingTensor.super_TPZFMatrix<double>,0,2);
      (Ei->fData).super_TPZVec<double>.fStore[2] = *pdVar3;
      pdVar3 = TPZFMatrix<double>::operator()(&resultingTensor.super_TPZFMatrix<double>,1,1);
      (Ei->fData).super_TPZVec<double>.fStore[3] = *pdVar3;
      pdVar3 = TPZFMatrix<double>::operator()(&resultingTensor.super_TPZFMatrix<double>,1,2);
      (Ei->fData).super_TPZVec<double>.fStore[4] = *pdVar3;
      pdVar3 = TPZFMatrix<double>::operator()(&resultingTensor.super_TPZFMatrix<double>,2,2);
      (Ei->fData).super_TPZVec<double>.fStore[5] = *pdVar3;
    }
  }
  TPZFNMatrix<9,_double>::~TPZFNMatrix(&resultingTensor);
  TPZFNMatrix<9,_double>::~TPZFNMatrix(&aux);
  TPZFNMatrix<9,_double>::~TPZFNMatrix(&local);
  return;
}

Assistant:

void TPZTensor<T>::EigenProjection(const TPZVec<T> &EigenVals, int index, const TPZVec<int> &DistinctEigenvalues, TPZTensor<T> &Ei) const {
    const int p = DistinctEigenvalues.NElements();
    TPZFNMatrix<9, T> local(3, 3), aux(3, 3), resultingTensor(3, 3);
    Ei.Identity();
    for (int count = 0; count < p; ++count) {
        const int j = DistinctEigenvalues[count];
        if (j == index) continue;
        local.Identity();
        local *= -1. * EigenVals[j];

        this->CopyToTensor(aux);
        local += aux;

#ifdef PZDEBUG
        if (AreEqual(EigenVals[index], EigenVals[j])) DebugStop();
#endif
        local *= 1. / (EigenVals[index] - EigenVals[j]);
        Ei.CopyToTensor(aux);
        aux.Multiply(local, resultingTensor);
        Ei[_XX_] = resultingTensor(0, 0);
        Ei[_XY_] = resultingTensor(0, 1);
        Ei[_XZ_] = resultingTensor(0, 2);
        Ei[_YY_] = resultingTensor(1, 1);
        Ei[_YZ_] = resultingTensor(1, 2);
        Ei[_ZZ_] = resultingTensor(2, 2);
    }//for j
}